

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int jsonGrow(JsonString *p,u32 N)

{
  char *pcVar1;
  sqlite3_uint64 local_38;
  char *zNew;
  u64 nTotal;
  u32 N_local;
  JsonString *p_local;
  
  if ((ulong)N < p->nAlloc) {
    local_38 = p->nAlloc << 1;
  }
  else {
    local_38 = p->nAlloc + (ulong)N + 10;
  }
  if (p->bStatic == '\0') {
    pcVar1 = (char *)sqlite3_realloc64(p->zBuf,local_38);
    if (pcVar1 == (char *)0x0) {
      jsonOom(p);
      return 7;
    }
    p->zBuf = pcVar1;
  }
  else {
    if (p->bErr != '\0') {
      return 1;
    }
    pcVar1 = (char *)sqlite3_malloc64(local_38);
    if (pcVar1 == (char *)0x0) {
      jsonOom(p);
      return 7;
    }
    memcpy(pcVar1,p->zBuf,p->nUsed);
    p->zBuf = pcVar1;
    p->bStatic = '\0';
  }
  p->nAlloc = local_38;
  return 0;
}

Assistant:

static int jsonGrow(JsonString *p, u32 N){
  u64 nTotal = N<p->nAlloc ? p->nAlloc*2 : p->nAlloc+N+10;
  char *zNew;
  if( p->bStatic ){
    if( p->bErr ) return 1;
    zNew = sqlite3_malloc64(nTotal);
    if( zNew==0 ){
      jsonOom(p);
      return SQLITE_NOMEM;
    }
    memcpy(zNew, p->zBuf, (size_t)p->nUsed);
    p->zBuf = zNew;
    p->bStatic = 0;
  }else{
    zNew = sqlite3_realloc64(p->zBuf, nTotal);
    if( zNew==0 ){
      jsonOom(p);
      return SQLITE_NOMEM;
    }
    p->zBuf = zNew;
  }
  p->nAlloc = nTotal;
  return SQLITE_OK;
}